

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.h
# Opt level: O3

void __thiscall
flatbuffers::AnnotatedBinaryTextGenerator::AnnotatedBinaryTextGenerator
          (AnnotatedBinaryTextGenerator *this,Options *options,
          map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
          *annotations,uint8_t *binary,int64_t binary_length)

{
  pointer pcVar1;
  
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->annotations_)._M_t._M_impl.super__Rb_tree_header,
             &(annotations->_M_t)._M_impl.super__Rb_tree_header);
  this->binary_ = binary;
  this->binary_length_ = binary_length;
  (this->options_).max_bytes_per_line = options->max_bytes_per_line;
  (this->options_).output_postfix._M_dataplus._M_p =
       (pointer)&(this->options_).output_postfix.field_2;
  pcVar1 = (options->output_postfix)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).output_postfix,pcVar1,
             pcVar1 + (options->output_postfix)._M_string_length);
  (this->options_).output_extension._M_dataplus._M_p =
       (pointer)&(this->options_).output_extension.field_2;
  pcVar1 = (options->output_extension)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).output_extension,pcVar1,
             pcVar1 + (options->output_extension)._M_string_length);
  (this->options_).include_vector_contents = options->include_vector_contents;
  return;
}

Assistant:

explicit AnnotatedBinaryTextGenerator(
      const Options &options, std::map<uint64_t, BinarySection> annotations,
      const uint8_t *const binary, const int64_t binary_length)
      : annotations_(std::move(annotations)),
        binary_(binary),
        binary_length_(binary_length),
        options_(options) {}